

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompStep(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  xmlXPathContextPtr ctxt_00;
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  char cVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  int ch2;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pbVar4 = ctxt->cur;
  while( true ) {
    pbVar3 = pbVar4 + 1;
    uVar9 = (ulong)*pbVar4;
    if (0x2e < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x2a) goto LAB_001c75d4;
      if (uVar9 == 0x2e) {
        if (*pbVar3 != 0x2e) {
          while( true ) {
            ctxt->cur = pbVar3;
            if (0x20 < (ulong)*pbVar3) {
              return;
            }
            if ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0) break;
            pbVar3 = pbVar3 + 1;
          }
          return;
        }
        goto LAB_001c74c6;
      }
      break;
    }
    ctxt->cur = pbVar3;
    pbVar4 = pbVar3;
  }
  pbVar4 = xmlXPathParseNCName(ctxt);
  if (pbVar4 == (byte *)0x0) {
    if (*ctxt->cur == '@') {
      ctxt->cur = ctxt->cur + 1;
      uVar13 = 3;
    }
    else {
LAB_001c75d4:
      uVar13 = 4;
    }
LAB_001c75da:
    pbVar4 = (byte *)0x0;
    goto switchD_001c756f_caseD_62;
  }
  bVar8 = *pbVar4;
  uVar13 = 4;
  if (bVar8 < 0x6e) {
    switch(bVar8) {
    case 0x61:
      iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"ancestor");
      iVar1 = xmlStrEqual(pbVar4,(xmlChar *)"ancestor-or-self");
      uVar11 = 2;
      if (iVar1 == 0) {
        uVar11 = (uint)(iVar2 != 0);
      }
      iVar2 = xmlStrEqual(pbVar4,"attribute");
      uVar12 = 3;
      break;
    default:
      goto switchD_001c756f_caseD_62;
    case 99:
      iVar2 = xmlStrEqual(pbVar4,"child");
      uVar13 = 4;
      uVar12 = 4;
      if (iVar2 == 0) goto switchD_001c756f_caseD_62;
      goto LAB_001c7720;
    case 100:
      iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"descendant");
      iVar1 = xmlStrEqual(pbVar4,(xmlChar *)"descendant-or-self");
      uVar12 = 6;
      if (iVar1 != 0) goto LAB_001c7720;
      uVar11 = (uint)(iVar2 != 0) * 5;
      goto LAB_001c7718;
    case 0x66:
      iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"following");
      uVar11 = 7;
      if (iVar2 == 0) {
        uVar11 = 0;
      }
      iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"following-sibling");
      uVar12 = 8;
    }
LAB_001c7714:
    if (iVar2 == 0) {
LAB_001c7718:
      uVar12 = uVar11;
      if (uVar11 == 0) goto LAB_001c775d;
    }
LAB_001c7720:
    uVar13 = uVar12;
    pbVar3 = ctxt->cur;
    while( true ) {
      pbVar5 = pbVar3 + 1;
      uVar9 = (ulong)*pbVar3;
      if (0x3a < uVar9) break;
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if ((uVar9 == 0x3a) && (*pbVar5 == 0x3a)) {
          ctxt->cur = pbVar3 + 2;
          (*xmlFree)(pbVar4);
          goto LAB_001c75da;
        }
        break;
      }
      ctxt->cur = pbVar5;
      pbVar3 = pbVar5;
    }
  }
  else {
    if (bVar8 == 0x6e) {
      iVar2 = xmlStrEqual(pbVar4,"namespace");
      uVar12 = 9;
    }
    else {
      if (bVar8 == 0x70) {
        iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"parent");
        uVar13 = 10;
        if (iVar2 == 0) {
          uVar13 = 0;
        }
        iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"preceding");
        uVar11 = 0xb;
        if (iVar2 == 0) {
          uVar11 = uVar13;
        }
        iVar2 = xmlStrEqual(pbVar4,(xmlChar *)"preceding-sibling");
        uVar12 = 0xc;
        goto LAB_001c7714;
      }
      if (bVar8 != 0x73) goto switchD_001c756f_caseD_62;
      iVar2 = xmlStrEqual(pbVar4,"self");
      uVar12 = 0xd;
    }
    if (iVar2 != 0) goto LAB_001c7720;
  }
LAB_001c775d:
  uVar13 = 4;
switchD_001c756f_caseD_62:
  if (ctxt->error != 0) goto LAB_001c7773;
  pbVar3 = ctxt->cur;
  while( true ) {
    uVar9 = (ulong)*pbVar3;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
    pbVar3 = pbVar3 + 1;
    ctxt->cur = pbVar3;
  }
  if (*pbVar3 == 0x2a && pbVar4 == (byte *)0x0) {
    ctxt->cur = pbVar3 + 1;
    iVar1 = 3;
    iVar2 = 0;
    pbVar4 = (byte *)0x0;
LAB_001c795b:
    pbVar5 = (byte *)0x0;
  }
  else {
    pbVar5 = pbVar4;
    if (pbVar4 == (byte *)0x0) {
      pbVar5 = xmlXPathParseNCName(ctxt);
      if (pbVar5 == (byte *)0x0) {
LAB_001c7aa8:
        xmlXPathErr(ctxt,7);
        return;
      }
      pbVar3 = ctxt->cur;
      uVar9 = (ulong)*pbVar3;
    }
    cVar7 = (char)uVar9;
    if (cVar7 == ' ') {
      bVar10 = false;
    }
    else {
      bVar10 = cVar7 != '\r' && (byte)(cVar7 - 0xbU) < 0xfe;
    }
LAB_001c780b:
    pbVar4 = pbVar3 + 1;
    if ((byte)uVar9 < 0x29) {
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001c7806;
      if (uVar9 == 0x28) {
        ctxt->cur = pbVar4;
        iVar2 = xmlStrEqual(pbVar5,"comment");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(pbVar5,"node");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(pbVar5,(xmlChar *)"processing-instruction");
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(pbVar5,"text");
              if (iVar2 != 0) {
                iVar2 = 3;
                goto LAB_001c783d;
              }
              (*xmlFree)(pbVar5);
              goto LAB_001c7aa8;
            }
            iVar2 = 7;
            bVar10 = true;
          }
          else {
            bVar10 = false;
            iVar2 = 0;
          }
        }
        else {
          iVar2 = 8;
LAB_001c783d:
          bVar10 = false;
        }
        pbVar4 = ctxt->cur;
        while( true ) {
          bVar8 = *pbVar4;
          if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
          pbVar4 = pbVar4 + 1;
          ctxt->cur = pbVar4;
        }
        if (bVar10) {
          (*xmlFree)(pbVar5);
          pbVar4 = ctxt->cur;
          if (*pbVar4 != 0x29) {
            pbVar5 = xmlXPathParseLiteral(ctxt);
            pbVar4 = ctxt->cur;
            while( true ) {
              bVar8 = *pbVar4;
              if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0))
              break;
              pbVar4 = pbVar4 + 1;
              ctxt->cur = pbVar4;
            }
            iVar1 = 2;
            goto LAB_001c7949;
          }
          iVar1 = 1;
          pbVar5 = (byte *)0x0;
LAB_001c7952:
          ctxt->cur = pbVar4 + 1;
          pbVar4 = pbVar5;
          goto LAB_001c795b;
        }
        iVar1 = 1;
LAB_001c7949:
        if (bVar8 == 0x29) goto LAB_001c7952;
        if (pbVar5 != (byte *)0x0) {
          (*xmlFree)(pbVar5);
        }
        xmlXPathErr(ctxt,8);
        pbVar4 = (byte *)0x0;
        pbVar5 = (byte *)0x0;
        goto LAB_001c795e;
      }
    }
    iVar2 = 0;
    if (!bVar10 || (byte)uVar9 != 0x3a) {
      iVar1 = 5;
      pbVar4 = pbVar5;
      goto LAB_001c795b;
    }
    ctxt->cur = pbVar4;
    if (*pbVar4 == 0x2a) {
      ctxt->cur = pbVar3 + 2;
      iVar1 = 3;
      pbVar4 = (byte *)0x0;
    }
    else {
      pbVar4 = xmlXPathParseNCName(ctxt);
      iVar1 = 5;
      if (pbVar4 == (byte *)0x0) {
        xmlXPathErr(ctxt,7);
        pbVar4 = (byte *)0x0;
      }
    }
    iVar2 = 0;
    ctxt_00 = ctxt->context;
    if ((ctxt_00 != (xmlXPathContextPtr)0x0) && ((ctxt_00->flags & 1) != 0)) {
      pxVar6 = xmlXPathNsLookup(ctxt_00,pbVar5);
      if (pxVar6 == (xmlChar *)0x0) {
        xmlXPathErr(ctxt,0x13);
      }
      iVar2 = 0;
    }
  }
LAB_001c795e:
  ch1 = ctxt->comp->last;
  ctxt->comp->last = -1;
  pbVar3 = ctxt->cur;
  while( true ) {
    bVar8 = *pbVar3;
    if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  }
  if (bVar8 == 0x5b) {
    do {
      xmlXPathCompPredicate(ctxt,0);
    } while (*ctxt->cur == '[');
    ch2 = ctxt->comp->last;
  }
  else {
    ch2 = -1;
  }
  iVar2 = xmlXPathCompExprAdd(ctxt,ch1,ch2,XPATH_OP_COLLECT,uVar13,iVar1,iVar2,pbVar5,pbVar4);
  if (iVar2 != -1) {
    return;
  }
  (*xmlFree)(pbVar5);
LAB_001c7773:
  (*xmlFree)(pbVar4);
  return;
LAB_001c7806:
  ctxt->cur = pbVar4;
  uVar9 = (ulong)*pbVar4;
  pbVar3 = pbVar4;
  goto LAB_001c780b;
  while ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0) {
LAB_001c74c6:
    pbVar3 = pbVar3 + 1;
    ctxt->cur = pbVar3;
    if (0x20 < (ulong)*pbVar3) break;
  }
  xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,10,1,0,(void *)0x0,(void *)0x0);
  return;
}

Assistant:

static void
xmlXPathCompStep(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '.') && (NXT(1) == '.')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_PARENT,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '.') {
	NEXT;
	SKIP_BLANKS;
    } else {
	xmlChar *name = NULL;
	xmlChar *prefix = NULL;
	xmlXPathTestVal test = (xmlXPathTestVal) 0;
	xmlXPathAxisVal axis = (xmlXPathAxisVal) 0;
	xmlXPathTypeVal type = (xmlXPathTypeVal) 0;
	int op1;

	if (CUR == '*') {
	    axis = AXIS_CHILD;
	} else {
	    if (name == NULL)
		name = xmlXPathParseNCName(ctxt);
	    if (name != NULL) {
		axis = xmlXPathIsAxisName(name);
		if (axis != 0) {
		    SKIP_BLANKS;
		    if ((CUR == ':') && (NXT(1) == ':')) {
			SKIP(2);
			xmlFree(name);
			name = NULL;
		    } else {
			/* an element name can conflict with an axis one :-\ */
			axis = AXIS_CHILD;
		    }
		} else {
		    axis = AXIS_CHILD;
		}
	    } else if (CUR == '@') {
		NEXT;
		axis = AXIS_ATTRIBUTE;
	    } else {
		axis = AXIS_CHILD;
	    }
	}

        if (ctxt->error != XPATH_EXPRESSION_OK) {
            xmlFree(name);
            return;
        }

	name = xmlXPathCompNodeTest(ctxt, &test, &type, &prefix, name);
	if (test == 0)
	    return;

        if ((prefix != NULL) && (ctxt->context != NULL) &&
	    (ctxt->context->flags & XML_XPATH_CHECKNS)) {
	    if (xmlXPathNsLookup(ctxt->context, prefix) == NULL) {
		xmlXPathErr(ctxt, XPATH_UNDEF_PREFIX_ERROR);
	    }
	}

	op1 = ctxt->comp->last;
	ctxt->comp->last = -1;

	SKIP_BLANKS;
	while (CUR == '[') {
	    xmlXPathCompPredicate(ctxt, 0);
	}

        if (PUSH_FULL_EXPR(XPATH_OP_COLLECT, op1, ctxt->comp->last, axis,
                           test, type, (void *)prefix, (void *)name) == -1) {
            xmlFree(prefix);
            xmlFree(name);
        }
    }
}